

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O1

void __thiscall
S2Cap::GetCellUnionBound(S2Cap *this,vector<S2CellId,_std::allocator<S2CellId>_> *cell_ids)

{
  pointer pSVar1;
  iterator __position;
  int iVar2;
  uint64 uVar3;
  long lVar4;
  S1Angle value;
  S2CellId local_38;
  
  pSVar1 = (cell_ids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((cell_ids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
      super__Vector_impl_data._M_finish != pSVar1) {
    (cell_ids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
    super__Vector_impl_data._M_finish = pSVar1;
  }
  value = S1ChordAngle::ToAngle(&this->radius_);
  iVar2 = S2::Metric<1>::GetLevelForMinValue((Metric<1> *)&S2::kMinWidth,value.radians_);
  if (iVar2 < 1) {
    lVar4 = 6;
    std::vector<S2CellId,_std::allocator<S2CellId>_>::reserve(cell_ids,6);
    uVar3 = 0x1000000000000000;
    do {
      __position._M_current =
           (cell_ids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (cell_ids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_38.id_ = uVar3;
        std::vector<S2CellId,_std::allocator<S2CellId>_>::_M_realloc_insert<S2CellId>
                  (cell_ids,__position,&local_38);
      }
      else {
        (__position._M_current)->id_ = uVar3;
        (cell_ids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar3 = uVar3 + 0x2000000000000000;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  else {
    std::vector<S2CellId,_std::allocator<S2CellId>_>::reserve(cell_ids,4);
    S2CellId::S2CellId(&local_38,&this->center_);
    S2CellId::AppendVertexNeighbors(&local_38,iVar2 + -1,cell_ids);
  }
  return;
}

Assistant:

void S2Cap::GetCellUnionBound(vector<S2CellId>* cell_ids) const {
  // TODO(ericv): The covering could be made quite a bit tighter by mapping
  // the cap to a rectangle in (i,j)-space and finding a covering for that.
  cell_ids->clear();

  // Find the maximum level such that the cap contains at most one cell vertex
  // and such that S2CellId::AppendVertexNeighbors() can be called.
  int level = S2::kMinWidth.GetLevelForMinValue(GetRadius().radians()) - 1;

  // If level < 0, then more than three face cells are required.
  if (level < 0) {
    cell_ids->reserve(6);
    for (int face = 0; face < 6; ++face) {
      cell_ids->push_back(S2CellId::FromFace(face));
    }
  } else {
    // The covering consists of the 4 cells at the given level that share the
    // cell vertex that is closest to the cap center.
    cell_ids->reserve(4);
    S2CellId(center_).AppendVertexNeighbors(level, cell_ids);
  }
}